

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall spv::Builder::makeBoolDebugType(Builder *this,int size)

{
  key_type kVar1;
  Id IVar2;
  Id IVar3;
  mapped_type *pmVar4;
  size_type sVar5;
  reference ppIVar6;
  Instruction *pIVar7;
  bool bVar8;
  value_type local_90;
  key_type local_88;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_59;
  string local_58;
  key_type local_34 [3];
  Instruction *pIStack_28;
  int t;
  Instruction *type;
  Builder *pBStack_18;
  int size_local;
  Builder *this_local;
  
  local_34[2] = 0;
  type._4_4_ = size;
  pBStack_18 = this;
  while( true ) {
    kVar1 = local_34[2];
    local_34[1] = 2;
    pmVar4 = std::
             unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
             ::operator[](&this->groupedDebugTypes,local_34 + 1);
    sVar5 = std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::size(pmVar4);
    if ((int)sVar5 <= (int)kVar1) {
      pIVar7 = (Instruction *)::operator_new(0x60);
      IVar2 = getUniqueId(this);
      IVar3 = makeVoidType(this);
      spv::Instruction::Instruction(pIVar7,IVar2,IVar3,OpExtInst);
      pIStack_28 = pIVar7;
      spv::Instruction::reserveOperands(pIVar7,6);
      spv::Instruction::addIdOperand(pIStack_28,this->nonSemanticShaderDebugInfo);
      spv::Instruction::addImmediateOperand(pIStack_28,2);
      pIVar7 = pIStack_28;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"bool",&local_81);
      IVar2 = getStringId(this,&local_80);
      spv::Instruction::addIdOperand(pIVar7,IVar2);
      std::__cxx11::string::~string((string *)&local_80);
      std::allocator<char>::~allocator(&local_81);
      pIVar7 = pIStack_28;
      IVar2 = makeUintConstant(this,type._4_4_,false);
      spv::Instruction::addIdOperand(pIVar7,IVar2);
      pIVar7 = pIStack_28;
      IVar2 = makeUintConstant(this,2,false);
      spv::Instruction::addIdOperand(pIVar7,IVar2);
      pIVar7 = pIStack_28;
      IVar2 = makeUintConstant(this,0,false);
      spv::Instruction::addIdOperand(pIVar7,IVar2);
      local_88 = 2;
      pmVar4 = std::
               unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
               ::operator[](&this->groupedDebugTypes,&local_88);
      std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::push_back
                (pmVar4,&stack0xffffffffffffffd8);
      std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
      unique_ptr<std::default_delete<spv::Instruction>,void>
                ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_90,
                 pIStack_28);
      std::
      vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ::push_back(&this->constantsTypesGlobals,&local_90);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                (&local_90);
      Module::mapInstruction(&this->module,pIStack_28);
      IVar2 = spv::Instruction::getResultId(pIStack_28);
      return IVar2;
    }
    local_34[0] = 2;
    pmVar4 = std::
             unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
             ::operator[](&this->groupedDebugTypes,local_34);
    ppIVar6 = std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::operator[]
                        (pmVar4,(long)(int)local_34[2]);
    pIStack_28 = *ppIVar6;
    IVar2 = spv::Instruction::getIdOperand(pIStack_28,0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"bool",&local_59);
    IVar3 = getStringId(this,&local_58);
    bVar8 = false;
    if (IVar2 == IVar3) {
      IVar2 = spv::Instruction::getIdOperand(pIStack_28,1);
      bVar8 = false;
      if (IVar2 == type._4_4_) {
        IVar2 = spv::Instruction::getIdOperand(pIStack_28,2);
        bVar8 = IVar2 == 2;
      }
    }
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator(&local_59);
    if (bVar8) break;
    local_34[2] = local_34[2] + 1;
  }
  IVar2 = spv::Instruction::getResultId(pIStack_28);
  return IVar2;
}

Assistant:

Id Builder::makeBoolDebugType(int const size)
{
    // try to find it
    Instruction* type;
    for (int t = 0; t < (int)groupedDebugTypes[NonSemanticShaderDebugInfo100DebugTypeBasic].size(); ++t) {
        type = groupedDebugTypes[NonSemanticShaderDebugInfo100DebugTypeBasic][t];
        if (type->getIdOperand(0) == getStringId("bool") &&
            type->getIdOperand(1) == static_cast<unsigned int>(size) &&
            type->getIdOperand(2) == NonSemanticShaderDebugInfo100Boolean)
            return type->getResultId();
    }

    type = new Instruction(getUniqueId(), makeVoidType(), OpExtInst);
    type->reserveOperands(6);
    type->addIdOperand(nonSemanticShaderDebugInfo);
    type->addImmediateOperand(NonSemanticShaderDebugInfo100DebugTypeBasic);

    type->addIdOperand(getStringId("bool")); // name id
    type->addIdOperand(makeUintConstant(size)); // size id
    type->addIdOperand(makeUintConstant(NonSemanticShaderDebugInfo100Boolean)); // encoding id
    type->addIdOperand(makeUintConstant(NonSemanticShaderDebugInfo100None)); // flags id

    groupedDebugTypes[NonSemanticShaderDebugInfo100DebugTypeBasic].push_back(type);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
    module.mapInstruction(type);

    return type->getResultId();
}